

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O0

void Fxch_SCHashTableDelete(Fxch_SCHashTable_t *pSCHashTable)

{
  uint local_14;
  uint i;
  Fxch_SCHashTable_t *pSCHashTable_local;
  
  for (local_14 = 0; local_14 <= pSCHashTable->SizeMask; local_14 = local_14 + 1) {
    if (pSCHashTable->pBins[local_14].vSCData != (Fxch_SubCube_t *)0x0) {
      free(pSCHashTable->pBins[local_14].vSCData);
      pSCHashTable->pBins[local_14].vSCData = (Fxch_SubCube_t *)0x0;
    }
  }
  Vec_IntErase(&pSCHashTable->vSubCube0);
  Vec_IntErase(&pSCHashTable->vSubCube1);
  if (pSCHashTable->pBins != (Fxch_SCHashTable_Entry_t *)0x0) {
    free(pSCHashTable->pBins);
    pSCHashTable->pBins = (Fxch_SCHashTable_Entry_t *)0x0;
  }
  if (pSCHashTable != (Fxch_SCHashTable_t *)0x0) {
    free(pSCHashTable);
  }
  return;
}

Assistant:

void Fxch_SCHashTableDelete( Fxch_SCHashTable_t* pSCHashTable )
{
    unsigned i;
    for ( i = 0; i <= pSCHashTable->SizeMask; i++ )
        ABC_FREE( pSCHashTable->pBins[i].vSCData );
    Vec_IntErase( &pSCHashTable->vSubCube0 );
    Vec_IntErase( &pSCHashTable->vSubCube1 );
    ABC_FREE( pSCHashTable->pBins );
    ABC_FREE( pSCHashTable );
}